

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_mixed_order
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  IProgramContextSupplier *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  bool bVar4;
  ShaderProgram *pSVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *pLVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  allocator<char> local_311;
  String decl;
  allocator<char> local_2e9;
  String local_2e8;
  String local_2c8;
  String local_2a8;
  long *local_288 [2];
  long local_278 [2];
  String local_268;
  String local_248;
  String local_228;
  String local_208;
  String local_1e8;
  String local_1c8;
  StringStream s;
  undefined4 extraout_var_01;
  
  std::ios_base::ios_base
            ((ios_base *)
             &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       glUniformMatrix3x2fv;
  s.super_ostringstream._328_8_ = 0;
  s.super_ostringstream._336_2_ = 0;
  s.super_ostringstream._344_8_ = 0;
  s.super_ostringstream._352_8_ = 0;
  s.super_ostringstream._360_8_ = 0;
  s.super_ostringstream._368_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__StringStream_020f2a68;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       &PTR__StringStream_020f2a90;
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_2e8,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(&decl,this,&local_2e8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&s,decl._M_dataplus._M_p,decl._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_ACCESS",&decl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  iVar6 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,*(char **)CONCAT44(extraout_var,iVar6),&local_311);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,"layout(binding=0, offset=0)","");
  iVar6 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,*(char **)(CONCAT44(extraout_var_00,iVar6) + 0x18),&local_2e9);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_1e8,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1c])(&local_268,this,&local_1e8);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_288,this,0);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"float","");
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1d])(&local_208,this,local_288,&local_2a8);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_228,this,0);
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  LayoutBindingBaseCase::buildUniformDecl
            (&decl,&this->super_LayoutBindingBaseCase,&local_2e8,&local_2c8,&local_248,&local_268,
             &local_208,&local_228,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  paVar2 = &local_228.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_DECL",&decl);
  LayoutBindingBaseCase::updateTemplate
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
  pIVar1 = &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier;
  iVar6 = (*(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier.
            _vptr_IProgramContextSupplier[6])(pIVar1);
  pLVar8 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar6);
  iVar6 = (*pLVar8->_vptr_LayoutBindingProgram[2])(pLVar8);
  pSVar5 = pLVar8->m_program;
  if (iVar6 == 2) {
    if (((*pSVar5->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bd239a;
  }
  else if (((*pSVar5->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == false)
  goto LAB_00bd239a;
  bVar4 = (pSVar5->m_program).m_info.linkOk;
  if (bVar4 == false) {
LAB_00bd239a:
    LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_2e8,pLVar8,false);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_2e8._M_dataplus._M_p,
               local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    (*pLVar8->_vptr_LayoutBindingProgram[1])(pLVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl._M_dataplus._M_p != &decl.field_2) {
      operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    std::ios_base::~ios_base
              ((ios_base *)
               &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70)
    ;
    return __return_storage_ptr__;
  }
  (*pLVar8->_vptr_LayoutBindingProgram[1])(pLVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base
            ((ios_base *)
             &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  iVar6 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&decl,*(char **)CONCAT44(extraout_var_02,iVar6),(allocator<char> *)&local_1c8
            );
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,"layout(offset=0, binding=0)","");
  iVar6 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,*(char **)(CONCAT44(extraout_var_03,iVar6) + 0x18),&local_311);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_268,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1c])(&local_248,this,&local_268);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_208,this,0);
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"float","");
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1d])(&local_1e8,this,&local_208,local_288);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_2a8,this,0);
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_228._M_dataplus._M_p = (pointer)paVar2;
  LayoutBindingBaseCase::buildUniformDecl
            ((String *)&s,&this->super_LayoutBindingBaseCase,&decl,&local_2e8,&local_2c8,&local_248,
             &local_1e8,&local_2a8,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_DECL",(String *)&s);
  LayoutBindingBaseCase::updateTemplate
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
  iVar6 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
  pLVar8 = (LayoutBindingProgram *)CONCAT44(extraout_var_04,iVar6);
  iVar6 = (*pLVar8->_vptr_LayoutBindingProgram[2])(pLVar8);
  pSVar5 = pLVar8->m_program;
  if (iVar6 == 2) {
    if (((*pSVar5->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true) {
LAB_00bd2455:
      if (((pSVar5->m_program).m_info.linkOk & bVar4) != 0) {
        (*pLVar8->_vptr_LayoutBindingProgram[1])(pLVar8);
        puVar3 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x10;
        if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream != (_func_int **)puVar3) {
          operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          CONCAT71(s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                   s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
        }
        s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
        s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
        __return_storage_ptr__->m_passed = true;
        __return_storage_ptr__->m_notRunForThisContext = false;
        (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_reason).field_2;
        s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
             = (_func_int **)puVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_reason,puVar3,puVar3);
        if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream == (_func_int **)puVar3) {
          return __return_storage_ptr__;
        }
        goto LAB_00bd253c;
      }
    }
  }
  else if (((*pSVar5->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false)
  goto LAB_00bd2455;
  LayoutBindingProgram::getErrorLog_abi_cxx11_(&decl,pLVar8,false);
  __return_storage_ptr__->m_passed = false;
  __return_storage_ptr__->m_notRunForThisContext = false;
  (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_reason).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_reason,decl._M_dataplus._M_p,
             decl._M_dataplus._M_p + decl._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  (*pLVar8->_vptr_LayoutBindingProgram[1])(pLVar8);
  if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
      == (_func_int **)
         &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    return __return_storage_ptr__;
  }
LAB_00bd253c:
  operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream,
                  CONCAT71(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                           _17_7_,s.super_ostringstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_mixed_order(void)
	{
		bool passed = true;

		{
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			String decl =
				buildUniformDecl(String(getTestParameters().keyword), String("layout(binding=0, offset=0)"),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
			setTemplateParam("UNIFORM_DECL", decl);
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}
		}
		{
			String decl =
				buildUniformDecl(String(getTestParameters().keyword), String("layout(offset=0, binding=0)"),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
			setTemplateParam("UNIFORM_DECL", decl);
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}
		}

		return true;
	}